

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAProtocol.h
# Opt level: O0

void ComputeChecksumNMEA(char *sentence,int sentencelen,char *checksum)

{
  byte local_25;
  int local_24;
  char res;
  int i;
  char *checksum_local;
  int sentencelen_local;
  char *sentence_local;
  
  local_25 = 0;
  memset(checksum,0,4);
  for (local_24 = 1; (local_24 < sentencelen && (sentence[local_24] != '*'));
      local_24 = local_24 + 1) {
    local_25 = local_25 ^ sentence[local_24];
  }
  sprintf(checksum,"*%02X",(ulong)local_25);
  return;
}

Assistant:

inline void ComputeChecksumNMEA(char* sentence, int sentencelen, char* checksum)
{
	int i = 0;
	char res = 0;

	// +1 for the null terminator character for strings.
	memset(checksum, 0, MAX_NB_BYTES_CHECKSUM_NMEA+1);
	i++; // Exclude start character.
	while (i < sentencelen)
	{
		if (sentence[i] == '*') break;
		res ^= sentence[i];
		i++;
	}
	sprintf(checksum, "*%02X", (int)(unsigned char)res);
	if (checksum[MAX_NB_BYTES_CHECKSUM_NMEA] != 0)
	{
		PRINT_DEBUG_WARNING(("Warning : NMEA checksum computation failed."));
	}
}